

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::Parenthesizer
          (Parenthesizer *this,ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *w,Expr e,
          int prec)

{
  Precedence PVar1;
  
  this->writer_ = w;
  if (prec == -1) {
    prec = w->precedence_;
  }
  this->saved_precedence_ = w->precedence_;
  PVar1 = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  this->write_paren_ = (int)PVar1 < prec;
  if ((int)PVar1 < prec) {
    fmt::BasicWriter<char>::operator<<(w->writer_,'(');
    PVar1 = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  }
  w->precedence_ = PVar1;
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::Parenthesizer(
    ExprWriter<ExprTypes, VarNamer> &w, Expr e, int prec)
: writer_(w), write_paren_(false) {
  saved_precedence_ = w.precedence_;
  if (prec == -1)
    prec = w.precedence_;
  write_paren_ = precedence(e) < prec;
  if (write_paren_)
    w.writer_ << '(';
  w.precedence_ = precedence(e);
}